

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTcpMeshHandler.c
# Opt level: O0

sbfBuffer_conflict sbfTcpMeshHandlerGetBuffer(sbfHandlerStream stream,size_t size)

{
  sbfBuffer_conflict psVar1;
  sbfPool in_RSI;
  size_t in_stack_ffffffffffffffe8;
  
  psVar1 = sbfBuffer_new(in_RSI,in_stack_ffffffffffffffe8);
  return psVar1;
}

Assistant:

static sbfBuffer
sbfTcpMeshHandlerGetBuffer (sbfHandlerStream stream, size_t size)
{
    return sbfBuffer_new (NULL, size);
}